

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name,App *parent)

{
  Formatter *this_00;
  ConfigBase *this_01;
  string *psVar1;
  string local_78;
  string local_58;
  allocator<char> local_35 [13];
  App *local_28;
  App *parent_local;
  string *app_name_local;
  string *app_description_local;
  App *this_local;
  
  this->_vptr_App = (_func_int **)&PTR__App_00191170;
  local_28 = parent;
  parent_local = (App *)app_name;
  app_name_local = app_description;
  app_description_local = (string *)this;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)app_name);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)app_description);
  this->allow_extras_ = false;
  this->allow_config_extras_ = ignore;
  this->prefix_command_ = false;
  this->has_automatic_name_ = false;
  this->required_ = false;
  this->disabled_ = false;
  this->pre_parse_called_ = false;
  this->immediate_callback_ = false;
  std::function<void_(unsigned_long)>::function(&this->pre_parse_callback_);
  std::function<void_()>::function(&this->parse_complete_callback_);
  std::function<void_()>::function(&this->final_callback_);
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2.
  _M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2 + 8) = 0;
  *(undefined8 *)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_ = 0;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_string_length = 0;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.disable_flag_override_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.delimiter_ = '\0';
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.always_capture_default_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_ = Throw;
  OptionBase<CLI::OptionDefaults>::OptionBase
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>);
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::vector(&this->options_);
  ::std::__cxx11::string::string((string *)&this->footer_);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&this->footer_callback_);
  this->help_ptr_ = (Option *)0x0;
  this->help_all_ptr_ = (Option *)0x0;
  this_00 = (Formatter *)operator_new(0x40);
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->super_FormatterBase).labels_._M_t._M_impl = 0;
  *(undefined8 *)
   &(this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->super_FormatterBase)._vptr_FormatterBase = (_func_int **)0x0;
  (this_00->super_FormatterBase).column_width_ = 0;
  Formatter::Formatter(this_00);
  ::std::shared_ptr<CLI::FormatterBase>::shared_ptr<CLI::Formatter,void>(&this->formatter_,this_00);
  ::std::function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)>::
  function<std::__cxx11::string(&)(CLI::App_const*,CLI::Error_const&),void>
            ((function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)> *)
             &this->failure_message_,FailureMessage::simple_abi_cxx11_);
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->missing_);
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector(&this->parse_order_);
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&this->parsed_subcommands_);
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
  ;
  *(undefined8 *)&(this->exclude_subcommands_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::set
            (&this->exclude_subcommands_);
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->exclude_options_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            (&this->exclude_options_);
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->need_subcommands_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::set
            (&this->need_subcommands_);
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->need_options_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            (&this->need_options_);
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::vector
            (&this->subcommands_);
  this->ignore_case_ = false;
  this->ignore_underscore_ = false;
  this->fallthrough_ = false;
  this->allow_windows_style_options_ = false;
  this->positionals_at_end_ = false;
  this->default_startup = stable;
  this->configurable_ = false;
  this->validate_positionals_ = false;
  this->parent_ = local_28;
  this->parsed_ = 0;
  this->require_subcommand_min_ = 0;
  this->require_subcommand_max_ = 0;
  this->require_option_min_ = 0;
  this->require_option_max_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->group_,"Subcommands",local_35);
  ::std::allocator<char>::~allocator(local_35);
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->aliases_);
  this->config_ptr_ = (Option *)0x0;
  this_01 = (ConfigBase *)operator_new(0x28);
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->super_Config)._vptr_Config = (_func_int **)0x0;
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_01->commentChar = '\0';
  this_01->arrayStart = '\0';
  this_01->arrayEnd = '\0';
  this_01->arraySeparator = '\0';
  this_01->valueDelimiter = '\0';
  *(undefined3 *)&this_01->field_0x25 = 0;
  ConfigBase::ConfigBase(this_01);
  ::std::shared_ptr<CLI::Config>::shared_ptr<CLI::ConfigBase,void>(&this->config_formatter_,this_01)
  ;
  if (this->parent_ != (App *)0x0) {
    if (this->parent_->help_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_58,this->parent_->help_ptr_,false,true);
      psVar1 = Option::get_description_abi_cxx11_(this->parent_->help_ptr_);
      set_help_flag(this,&local_58,psVar1);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if (this->parent_->help_all_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_78,this->parent_->help_all_ptr_,false,true);
      psVar1 = Option::get_description_abi_cxx11_(this->parent_->help_all_ptr_);
      set_help_all_flag(this,&local_78,psVar1);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    OptionDefaults::operator=(&this->option_defaults_,&this->parent_->option_defaults_);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    this->allow_extras_ = (bool)(this->parent_->allow_extras_ & 1);
    this->allow_config_extras_ = this->parent_->allow_config_extras_;
    this->prefix_command_ = (bool)(this->parent_->prefix_command_ & 1);
    this->immediate_callback_ = (bool)(this->parent_->immediate_callback_ & 1);
    this->ignore_case_ = (bool)(this->parent_->ignore_case_ & 1);
    this->ignore_underscore_ = (bool)(this->parent_->ignore_underscore_ & 1);
    this->fallthrough_ = (bool)(this->parent_->fallthrough_ & 1);
    this->validate_positionals_ = (bool)(this->parent_->validate_positionals_ & 1);
    this->configurable_ = (bool)(this->parent_->configurable_ & 1);
    this->allow_windows_style_options_ = (bool)(this->parent_->allow_windows_style_options_ & 1);
    ::std::__cxx11::string::operator=((string *)&this->group_,(string *)&this->parent_->group_);
    ::std::__cxx11::string::operator=((string *)&this->footer_,(string *)&this->parent_->footer_);
    std::shared_ptr<CLI::FormatterBase>::operator=(&this->formatter_,&this->parent_->formatter_);
    std::shared_ptr<CLI::Config>::operator=
              (&this->config_formatter_,&this->parent_->config_formatter_);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string app_description, std::string app_name, App *parent)
        : name_(std::move(app_name)), description_(std::move(app_description)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(false, true), parent_->help_ptr_->get_description());
            if(parent_->help_all_ptr_ != nullptr)
                set_help_all_flag(parent_->help_all_ptr_->get_name(false, true),
                                  parent_->help_all_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            allow_config_extras_ = parent_->allow_config_extras_;
            prefix_command_ = parent_->prefix_command_;
            immediate_callback_ = parent_->immediate_callback_;
            ignore_case_ = parent_->ignore_case_;
            ignore_underscore_ = parent_->ignore_underscore_;
            fallthrough_ = parent_->fallthrough_;
            validate_positionals_ = parent_->validate_positionals_;
            configurable_ = parent_->configurable_;
            allow_windows_style_options_ = parent_->allow_windows_style_options_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            formatter_ = parent_->formatter_;
            config_formatter_ = parent_->config_formatter_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }